

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Orphan<capnp::compiler::Expression> *
kj::_::
CopyConstructArray_<capnp::Orphan<capnp::compiler::Expression>,_capnp::Orphan<capnp::compiler::Expression>_*,_true,_false>
::apply(Orphan<capnp::compiler::Expression> *pos,Orphan<capnp::compiler::Expression> *start,
       Orphan<capnp::compiler::Expression> *end)

{
  ExceptionGuard local_28;
  
  for (; start != end; start = (Orphan<capnp::compiler::Expression> *)(&start->builder + 1)) {
    capnp::_::OrphanBuilder::OrphanBuilder(&pos->builder,&start->builder);
    pos = (Orphan<capnp::compiler::Expression> *)(&pos->builder + 1);
  }
  local_28.start = pos;
  local_28.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return (Orphan<capnp::compiler::Expression> *)&pos->builder;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }